

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

JsonNode * jsonLookupStep(JsonParse *pParse,u32 iRoot,char *zPath,int *pApnd,char **pzErr)

{
  char *zContent;
  byte *pbVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  JsonNode *pJVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  u8 *puVar12;
  char *__s2;
  int iVar13;
  u32 uVar14;
  size_t __n;
  JsonNode *pJVar15;
  
  uVar10 = (ulong)iRoot;
  pJVar6 = pParse->aNode;
LAB_001cf7ae:
  pJVar15 = pJVar6 + uVar10;
  cVar2 = *zPath;
  if (cVar2 == '.') {
    if (pJVar15->eType == '\a') {
      zContent = zPath + 1;
      cVar2 = zPath[1];
      if (cVar2 == '\"') {
        __n = 0;
        while( true ) {
          uVar7 = (int)__n + 1;
          if (zContent[uVar7] == '\0') goto LAB_001cfa74;
          if (zContent[uVar7] == '\"') break;
          __n = (size_t)uVar7;
        }
        uVar7 = (int)__n + 2;
        __s2 = zPath + 2;
      }
      else {
        __n = 0;
        while (((uVar7 = (uint)__n, __s2 = zContent, cVar2 != '\0' && (cVar2 != '.')) &&
               (cVar2 != '['))) {
          __n = (size_t)(uVar7 + 1);
          cVar2 = zContent[__n];
        }
      }
      uVar14 = (u32)__n;
      if (uVar14 != 0) {
        do {
          uVar5 = pJVar15->n;
          iVar3 = (int)uVar10;
          if (uVar5 != 0) {
            uVar8 = 1;
            do {
              if ((pJVar15[uVar8].jnFlags & 1) == 0) {
                if (pJVar15[uVar8].n == uVar14 + 2) {
                  puVar12 = &(pJVar15[uVar8].u.pPatch)->jnFlags;
LAB_001cf98e:
                  iVar4 = strncmp((char *)puVar12,__s2,__n);
                  if (iVar4 == 0) {
                    uVar10 = (ulong)(iVar3 + (int)uVar8 + 1);
                    zPath = zContent + uVar7;
                    goto LAB_001cf7ae;
                  }
                }
              }
              else if (pJVar15[uVar8].n == uVar14) {
                puVar12 = (u8 *)pJVar15[uVar8].u.zJContent;
                goto LAB_001cf98e;
              }
              uVar11 = (int)uVar8 + 1;
              iVar4 = 1;
              if (5 < pJVar15[uVar11].eType) {
                iVar4 = pJVar15[uVar11].n + 1;
              }
              uVar8 = (ulong)(iVar4 + uVar11);
            } while (iVar4 + uVar11 <= uVar5);
          }
          if ((pJVar15->jnFlags & 0x20) == 0) {
            if (pApnd == (int *)0x0) {
              return (JsonNode *)0x0;
            }
            iVar4 = jsonParseAddNode(pParse,7,2,(char *)0x0);
            uVar5 = jsonParseAddNode(pParse,5,uVar7,zContent);
            pJVar6 = jsonLookupAppend(pParse,zContent + uVar7,pApnd,pzErr);
            if (pParse->oom == '\0') {
              if (pJVar6 != (JsonNode *)0x0) {
                pJVar15 = pParse->aNode;
                pJVar15[uVar10].u.iAppend = iVar4 - iVar3;
                puVar12 = &pJVar15[uVar10].jnFlags;
                *puVar12 = *puVar12 | 0x20;
                puVar12 = &pParse->aNode[uVar5].jnFlags;
                *puVar12 = *puVar12 | 1;
                return pJVar6;
              }
              return (JsonNode *)0x0;
            }
            return (JsonNode *)0x0;
          }
          uVar10 = (ulong)(iVar3 + (pJVar15->u).iAppend);
          pJVar15 = pJVar6 + uVar10;
        } while( true );
      }
LAB_001cfa74:
      *pzErr = zContent;
    }
  }
  else {
    if (cVar2 == '[') {
      uVar8 = (ulong)(byte)zPath[1];
      if (0xfffffffffffffff5 < uVar8 - 0x3a) {
        if (pJVar15->eType != '\x06') {
          return (JsonNode *)0x0;
        }
        iVar3 = 0;
        uVar9 = 2;
        do {
          iVar3 = (int)(char)uVar8 + iVar3 * 10 + -0x30;
          pbVar1 = (byte *)(zPath + uVar9);
          uVar8 = (ulong)*pbVar1;
          uVar9 = (ulong)((int)uVar9 + 1);
        } while (0xfffffffffffffff5 < uVar8 - 0x3a);
        if (*pbVar1 != 0x5d) {
          *pzErr = zPath;
          return (JsonNode *)0x0;
        }
        zPath = zPath + uVar9;
        do {
          iVar4 = (int)uVar10;
          if (pJVar15->n != 0) {
            uVar8 = 1;
            do {
              if ((iVar3 == 0) && ((pJVar15[uVar8].jnFlags & 4) == 0)) {
                iVar3 = 0;
                if ((pJVar15->jnFlags & 0x20) != 0) goto LAB_001cf89b;
                uVar10 = (ulong)(uint)((int)uVar8 + iVar4);
                goto LAB_001cf7ae;
              }
              iVar13 = 1;
              if (5 < pJVar15[uVar8].eType) {
                iVar13 = pJVar15[uVar8].n + 1;
              }
              iVar3 = iVar3 + (char)(((pJVar15[uVar8].jnFlags >> 2 & 1) != 0) + -1);
              uVar7 = (int)uVar8 + iVar13;
              uVar8 = (ulong)uVar7;
            } while (uVar7 <= pJVar15->n);
          }
          if ((pJVar15->jnFlags & 0x20) == 0) {
            if (pApnd == (int *)0x0) {
              return (JsonNode *)0x0;
            }
            if (iVar3 != 0) {
              return (JsonNode *)0x0;
            }
            iVar3 = jsonParseAddNode(pParse,6,1,(char *)0x0);
            pJVar6 = jsonLookupAppend(pParse,zPath,pApnd,pzErr);
            if (pParse->oom != '\0') {
              return (JsonNode *)0x0;
            }
            if (pJVar6 != (JsonNode *)0x0) {
              pJVar15 = pParse->aNode;
              pJVar15[uVar10].u.iAppend = iVar3 - iVar4;
              puVar12 = &pJVar15[uVar10].jnFlags;
              *puVar12 = *puVar12 | 0x20;
              return pJVar6;
            }
            return (JsonNode *)0x0;
          }
LAB_001cf89b:
          uVar10 = (ulong)(iVar4 + (pJVar15->u).iAppend);
          pJVar15 = pJVar6 + uVar10;
        } while( true );
      }
    }
    else if (cVar2 == '\0') {
      return pJVar15;
    }
    *pzErr = zPath;
  }
  return (JsonNode *)0x0;
}

Assistant:

static JsonNode *jsonLookupStep(
  JsonParse *pParse,      /* The JSON to search */
  u32 iRoot,              /* Begin the search at this node */
  const char *zPath,      /* The path to search */
  int *pApnd,             /* Append nodes to complete path if not NULL */
  const char **pzErr      /* Make *pzErr point to any syntax error in zPath */
){
  u32 i, j, nKey;
  const char *zKey;
  JsonNode *pRoot = &pParse->aNode[iRoot];
  if( zPath[0]==0 ) return pRoot;
  if( zPath[0]=='.' ){
    if( pRoot->eType!=JSON_OBJECT ) return 0;
    zPath++;
    if( zPath[0]=='"' ){
      zKey = zPath + 1;
      for(i=1; zPath[i] && zPath[i]!='"'; i++){}
      nKey = i-1;
      if( zPath[i] ){
        i++;
      }else{
        *pzErr = zPath;
        return 0;
      }
    }else{
      zKey = zPath;
      for(i=0; zPath[i] && zPath[i]!='.' && zPath[i]!='['; i++){}
      nKey = i;
    }
    if( nKey==0 ){
      *pzErr = zPath;
      return 0;
    }
    j = 1;
    for(;;){
      while( j<=pRoot->n ){
        if( jsonLabelCompare(pRoot+j, zKey, nKey) ){
          return jsonLookupStep(pParse, iRoot+j+1, &zPath[i], pApnd, pzErr);
        }
        j++;
        j += jsonNodeSize(&pRoot[j]);
      }
      if( (pRoot->jnFlags & JNODE_APPEND)==0 ) break;
      iRoot += pRoot->u.iAppend;
      pRoot = &pParse->aNode[iRoot];
      j = 1;
    }
    if( pApnd ){
      u32 iStart, iLabel;
      JsonNode *pNode;
      iStart = jsonParseAddNode(pParse, JSON_OBJECT, 2, 0);
      iLabel = jsonParseAddNode(pParse, JSON_STRING, i, zPath);
      zPath += i;
      pNode = jsonLookupAppend(pParse, zPath, pApnd, pzErr);
      if( pParse->oom ) return 0;
      if( pNode ){
        pRoot = &pParse->aNode[iRoot];
        pRoot->u.iAppend = iStart - iRoot;
        pRoot->jnFlags |= JNODE_APPEND;
        pParse->aNode[iLabel].jnFlags |= JNODE_RAW;
      }
      return pNode;
    }
  }else if( zPath[0]=='[' && safe_isdigit(zPath[1]) ){
    if( pRoot->eType!=JSON_ARRAY ) return 0;
    i = 0;
    j = 1;
    while( safe_isdigit(zPath[j]) ){
      i = i*10 + zPath[j] - '0';
      j++;
    }
    if( zPath[j]!=']' ){
      *pzErr = zPath;
      return 0;
    }
    zPath += j + 1;
    j = 1;
    for(;;){
      while( j<=pRoot->n && (i>0 || (pRoot[j].jnFlags & JNODE_REMOVE)!=0) ){
        if( (pRoot[j].jnFlags & JNODE_REMOVE)==0 ) i--;
        j += jsonNodeSize(&pRoot[j]);
      }
      if( (pRoot->jnFlags & JNODE_APPEND)==0 ) break;
      iRoot += pRoot->u.iAppend;
      pRoot = &pParse->aNode[iRoot];
      j = 1;
    }
    if( j<=pRoot->n ){
      return jsonLookupStep(pParse, iRoot+j, zPath, pApnd, pzErr);
    }
    if( i==0 && pApnd ){
      u32 iStart;
      JsonNode *pNode;
      iStart = jsonParseAddNode(pParse, JSON_ARRAY, 1, 0);
      pNode = jsonLookupAppend(pParse, zPath, pApnd, pzErr);
      if( pParse->oom ) return 0;
      if( pNode ){
        pRoot = &pParse->aNode[iRoot];
        pRoot->u.iAppend = iStart - iRoot;
        pRoot->jnFlags |= JNODE_APPEND;
      }
      return pNode;
    }
  }else{
    *pzErr = zPath;
  }
  return 0;
}